

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.cpp
# Opt level: O1

EncodeNumberStatus
spvtools::utils::ParseAndEncodeFloatingPointNumber
          (char *text,NumberType *type,function<void_(unsigned_int)> *emit,string *error_msg)

{
  uint32_t uVar1;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  HVar2;
  bool bVar3;
  EncodeNumberStatus EVar4;
  char *val;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  hVal;
  ErrorMsgStream local_38;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  local_28;
  
  if (text == (char *)0x0) {
    anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
    text = "The given text is a nullptr";
LAB_0062060b:
    (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_38,text);
    anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_38);
    EVar4 = kInvalidText;
  }
  else {
    if (type->kind != SPV_NUMBER_FLOATING) {
      anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
      (anonymous_namespace)::ErrorMsgStream::operator<<
                ((ErrorMsgStream *)&local_38,"The expected type is not a float type");
      anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_38);
      return kInvalidUsage;
    }
    uVar1 = type->bitwidth;
    if (uVar1 == 0x40) {
      local_28.value_.data_ = (FloatProxy<double>)0;
      bVar3 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>>
                        (text,&local_28);
      HVar2.value_.data_ = (FloatProxy<double>)(FloatProxy<double>)local_28;
      if (!bVar3) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
        val = "Invalid 64-bit float literal: ";
        goto LAB_006205fd;
      }
      local_38.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = (uint)local_28.value_.data_;
      if ((emit->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00620628;
      (*emit->_M_invoker)((_Any_data *)emit,(uint *)&local_38);
      local_38.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = HVar2.value_.data_._4_4_;
    }
    else if (uVar1 == 0x20) {
      local_28.value_.data_ =
           (FloatProxy<double>)((ulong)local_28.value_.data_ & 0xffffffff00000000);
      bVar3 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>>
                        (text,(HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                               *)&local_28);
      if (!bVar3) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
        val = "Invalid 32-bit float literal: ";
        goto LAB_006205fd;
      }
      local_38.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = (uint)local_28.value_.data_;
    }
    else {
      if (uVar1 != 0x10) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
        (anonymous_namespace)::ErrorMsgStream::operator<<
                  ((ErrorMsgStream *)&local_38,"Unsupported ");
        if ((void *)CONCAT44(local_38.stream_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (uint)local_38.stream_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl) != (void *)0x0) {
          std::ostream::operator<<
                    ((void *)CONCAT44(local_38.stream_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_,
                                      (uint)local_38.stream_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl),uVar1);
        }
        (anonymous_namespace)::ErrorMsgStream::operator<<
                  ((ErrorMsgStream *)&local_38,"-bit float literals");
        anon_unknown_11::ErrorMsgStream::~ErrorMsgStream(&local_38);
        return kUnsupported;
      }
      local_28.value_.data_ =
           (FloatProxy<double>)((ulong)local_28.value_.data_ & 0xffffffffffff0000);
      bVar3 = ParseNumber<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
                        (text,(HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                               *)&local_28);
      if (!bVar3) {
        anon_unknown_11::ErrorMsgStream::ErrorMsgStream(&local_38,error_msg);
        val = "Invalid 16-bit float literal: ";
LAB_006205fd:
        (anonymous_namespace)::ErrorMsgStream::operator<<((ErrorMsgStream *)&local_38,val);
        goto LAB_0062060b;
      }
      local_38.stream_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = (uint)(ushort)local_28.value_.data_;
    }
    if ((emit->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00620628:
      std::__throw_bad_function_call();
    }
    (*emit->_M_invoker)((_Any_data *)emit,(uint *)&local_38);
    EVar4 = kSuccess;
  }
  return EVar4;
}

Assistant:

EncodeNumberStatus ParseAndEncodeFloatingPointNumber(
    const char* text, const NumberType& type,
    std::function<void(uint32_t)> emit, std::string* error_msg) {
  if (!text) {
    ErrorMsgStream(error_msg) << "The given text is a nullptr";
    return EncodeNumberStatus::kInvalidText;
  }

  if (!IsFloating(type)) {
    ErrorMsgStream(error_msg) << "The expected type is not a float type";
    return EncodeNumberStatus::kInvalidUsage;
  }

  const auto bit_width = AssumedBitWidth(type);
  switch (bit_width) {
    case 16: {
      HexFloat<FloatProxy<Float16>> hVal(0);
      if (!ParseNumber(text, &hVal)) {
        ErrorMsgStream(error_msg) << "Invalid 16-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      // getAsFloat will return the Float16 value, and get_value
      // will return a uint16_t representing the bits of the float.
      // The encoding is therefore correct from the perspective of the SPIR-V
      // spec since the top 16 bits will be 0.
      emit(static_cast<uint32_t>(hVal.value().getAsFloat().get_value()));
      return EncodeNumberStatus::kSuccess;
    } break;
    case 32: {
      HexFloat<FloatProxy<float>> fVal(0.0f);
      if (!ParseNumber(text, &fVal)) {
        ErrorMsgStream(error_msg) << "Invalid 32-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      emit(BitwiseCast<uint32_t>(fVal));
      return EncodeNumberStatus::kSuccess;
    } break;
    case 64: {
      HexFloat<FloatProxy<double>> dVal(0.0);
      if (!ParseNumber(text, &dVal)) {
        ErrorMsgStream(error_msg) << "Invalid 64-bit float literal: " << text;
        return EncodeNumberStatus::kInvalidText;
      }
      uint64_t decoded_val = BitwiseCast<uint64_t>(dVal);
      uint32_t low = uint32_t(0x00000000ffffffff & decoded_val);
      uint32_t high = uint32_t((0xffffffff00000000 & decoded_val) >> 32);
      emit(low);
      emit(high);
      return EncodeNumberStatus::kSuccess;
    } break;
    default:
      break;
  }
  ErrorMsgStream(error_msg)
      << "Unsupported " << bit_width << "-bit float literals";
  return EncodeNumberStatus::kUnsupported;
}